

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  size_t sVar3;
  Rep *__src;
  SizedPtr SVar4;
  size_t old_size;
  Rep *old_rep;
  char *alloc_1;
  SizedPtr alloc;
  size_t new_size;
  Voidify local_91;
  unsigned_long local_90;
  int local_84;
  Nullable<const_char_*> local_80;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint *puStack_70;
  int new_capacity;
  Rep *new_rep;
  Arena *arena;
  undefined8 uStack_58;
  int old_capacity;
  size_t kMaxCapacity;
  size_t kMaxSize;
  size_t kPtrSize;
  byte local_29;
  LogMessage local_28;
  Voidify local_15;
  int local_14;
  RepeatedPtrFieldBase *pRStack_10;
  int extend_amount_local;
  RepeatedPtrFieldBase *this_local;
  
  local_29 = 0;
  local_14 = extend_amount;
  pRStack_10 = this;
  if (extend_amount < 1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0x30,"extend_amount > 0");
    local_29 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_15,pLVar2);
  }
  if ((local_29 & 1) == 0) {
    kMaxSize = 8;
    kMaxCapacity = 0xffffffffffffffff;
    uStack_58 = 0x1ffffffffffffffe;
    arena._4_4_ = Capacity(this);
    new_rep = (Rep *)GetArena(this);
    puStack_70 = (uint *)0x0;
    absl_log_internal_check_op_result._4_4_ =
         CalculateReserveSize<void*,8>(arena._4_4_,arena._4_4_ + local_14);
    local_84 = absl::lts_20250127::log_internal::GetReferenceableValue
                         (absl_log_internal_check_op_result._4_4_);
    local_90 = absl::lts_20250127::log_internal::GetReferenceableValue(0x1ffffffffffffffe);
    local_80 = absl::lts_20250127::log_internal::Check_LEImpl<int,unsigned_long>
                         (&local_84,&local_90,"new_capacity <= kMaxCapacity");
    if (local_80 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_80);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&new_size,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                 ,0x3a,failure_msg);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&new_size)
      ;
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [62])
                                 "New capacity is too large to fit into internal representation");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&new_size);
    }
    sVar3 = (long)absl_log_internal_check_op_result._4_4_ * 8 + 8;
    if (new_rep == (Rep *)0x0) {
      SVar4 = AllocateAtLeast(sVar3);
      alloc.p = (void *)SVar4.n;
      absl_log_internal_check_op_result._4_4_ = (int)((long)alloc.p - 8U >> 3);
      alloc_1 = (char *)SVar4.p;
      puStack_70 = (uint *)alloc_1;
    }
    else {
      puStack_70 = (uint *)Arena::CreateArray<char>((Arena *)new_rep,sVar3);
    }
    this->capacity_proxy_ = absl_log_internal_check_op_result._4_4_ + -1;
    bVar1 = using_sso(this);
    if (bVar1) {
      *puStack_70 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
      *(void **)(puStack_70 + 2) = this->tagged_rep_or_elem_;
    }
    else {
      __src = rep(this);
      memcpy(puStack_70,__src,(long)__src->allocated_size * 8 + 8);
      sVar3 = (long)arena._4_4_ * 8 + 8;
      if (new_rep == (Rep *)0x0) {
        SizedDelete(__src,sVar3);
      }
      else {
        Arena::ReturnArrayMemory((Arena *)new_rep,__src,sVar3);
      }
    }
    this->tagged_rep_or_elem_ = (char *)((long)puStack_70 + 1);
    return (void **)(puStack_70 + (long)this->current_size_ * 2 + 2);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  ABSL_DCHECK(extend_amount > 0);
  constexpr size_t kPtrSize = sizeof(rep()->elements[0]);
  constexpr size_t kMaxSize = std::numeric_limits<size_t>::max();
  constexpr size_t kMaxCapacity = (kMaxSize - kRepHeaderSize) / kPtrSize;
  const int old_capacity = Capacity();
  Arena* arena = GetArena();
  Rep* new_rep = nullptr;
  {
    int new_capacity = internal::CalculateReserveSize<void*, kRepHeaderSize>(
        old_capacity, old_capacity + extend_amount);
    ABSL_DCHECK_LE(new_capacity, kMaxCapacity)
        << "New capacity is too large to fit into internal representation";
    const size_t new_size = kRepHeaderSize + kPtrSize * new_capacity;
    if (arena == nullptr) {
      const internal::SizedPtr alloc = internal::AllocateAtLeast(new_size);
      new_capacity = static_cast<int>((alloc.n - kRepHeaderSize) / kPtrSize);
      new_rep = reinterpret_cast<Rep*>(alloc.p);
    } else {
      auto* alloc = Arena::CreateArray<char>(arena, new_size);
      new_rep = reinterpret_cast<Rep*>(alloc);
    }
    capacity_proxy_ = new_capacity - kSSOCapacity;
  }

  if (using_sso()) {
    new_rep->allocated_size = tagged_rep_or_elem_ != nullptr ? 1 : 0;
    new_rep->elements[0] = tagged_rep_or_elem_;
  } else {
    Rep* old_rep = rep();
    memcpy(new_rep, old_rep,
           old_rep->allocated_size * kPtrSize + kRepHeaderSize);
    size_t old_size = old_capacity * kPtrSize + kRepHeaderSize;
    if (arena == nullptr) {
      internal::SizedDelete(old_rep, old_size);
    } else {
      arena->ReturnArrayMemory(old_rep, old_size);
    }
  }

  tagged_rep_or_elem_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(new_rep) + 1);

  return &new_rep->elements[current_size_];
}